

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

BOOL __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::FastIdentifierContinue
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *p,EncodedCharPtr last)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  EncodedChar currentChar;
  EncodedCharPtr last_local;
  EncodedCharPtr *p_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  while( true ) {
    if (last <= *p) {
      return 1;
    }
    bVar1 = **p;
    BVar4 = UTF8EncodingPolicyBase<false>::IsMultiUnitChar((ushort)bVar1);
    if (BVar4 != 0) {
      return 0;
    }
    if ((bVar1 == 0x5c) &&
       (bVar3 = Js::CharClassifier::IsIdContinueFast<false>(this->charClassifier,0x5c), bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x1bf,
                         "(currentChar != \'\\\\\' || !charClassifier->IsIdContinueFast<false>(currentChar))"
                         ,
                         "currentChar != \'\\\\\' || !charClassifier->IsIdContinueFast<false>(currentChar)"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar3 = Js::CharClassifier::IsIdContinueFast<false>(this->charClassifier,(uint)bVar1);
    if (!bVar3) break;
    *p = *p + 1;
  }
  return (uint)(bVar1 != 0x5c);
}

Assistant:

BOOL Scanner<EncodingPolicy>::FastIdentifierContinue(EncodedCharPtr&p, EncodedCharPtr last)
{
    if (EncodingPolicy::MultiUnitEncoding)
    {
        while (p < last)
        {
            EncodedChar currentChar = *p;
            if (this->IsMultiUnitChar(currentChar))
            {
                // multi unit character, we may not have reach the end yet
                return FALSE;
            }
            Assert(currentChar != '\\' || !charClassifier->IsIdContinueFast<false>(currentChar));
            if (!charClassifier->IsIdContinueFast<false>(currentChar))
            {
                // only reach the end of the identifier if it is not the start of an escape sequence
                return currentChar != '\\';
            }
            p++;
        }
        // We have reach the end of the identifier.
        return TRUE;
    }

    // Not fast path for non multi unit encoding
    return false;
}